

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shape-description.cpp
# Opt level: O3

bool msdfgen::writeShapeDescription(FILE *output,Shape *shape)

{
  bool bVar1;
  bool bVar2;
  EdgeSegment *pEVar3;
  long lVar4;
  undefined8 uVar5;
  const_iterator edge;
  pointer this;
  pointer pCVar6;
  
  bVar2 = Shape::validate(shape);
  if (bVar2) {
    if (shape->inverseYAxis == true) {
      fwrite("@invert-y\n",10,1,(FILE *)output);
    }
    pCVar6 = (shape->contours).
             super__Vector_base<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (pCVar6 != (shape->contours).
                  super__Vector_base<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      do {
        fwrite("{\n",2,1,(FILE *)output);
        this = (pCVar6->edges).
               super__Vector_base<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>._M_impl
               .super__Vector_impl_data._M_start;
        if (this != (pCVar6->edges).
                    super__Vector_base<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>.
                    _M_impl.super__Vector_impl_data._M_finish) {
          do {
            pEVar3 = EdgeHolder::operator->(this);
            uVar5 = 0;
            bVar1 = true;
            switch(pEVar3->color) {
            case YELLOW:
              uVar5 = 0x79;
              break;
            default:
              goto switchD_0016871f_caseD_4;
            case MAGENTA:
              uVar5 = 0x6d;
              break;
            case CYAN:
              uVar5 = 99;
              break;
            case WHITE:
              uVar5 = 0x77;
            }
            bVar1 = false;
switchD_0016871f_caseD_4:
            pEVar3 = EdgeHolder::operator*(this);
            lVar4 = __dynamic_cast(pEVar3,&EdgeSegment::typeinfo,&LinearSegment::typeinfo,0);
            if (lVar4 != 0) {
              fputc(9,(FILE *)output);
              fprintf((FILE *)output,"%.12g, %.12g",*(undefined8 *)(lVar4 + 0x10),
                      *(undefined8 *)(lVar4 + 0x18));
              fwrite(";\n",2,1,(FILE *)output);
              if (!bVar1) {
                fprintf((FILE *)output,"\t\t%c;\n",uVar5);
              }
            }
            pEVar3 = EdgeHolder::operator*(this);
            lVar4 = __dynamic_cast(pEVar3,&EdgeSegment::typeinfo,&QuadraticSegment::typeinfo,0);
            if (lVar4 != 0) {
              fputc(9,(FILE *)output);
              fprintf((FILE *)output,"%.12g, %.12g",*(undefined8 *)(lVar4 + 0x10),
                      *(undefined8 *)(lVar4 + 0x18));
              fwrite(";\n\t\t",4,1,(FILE *)output);
              if (!bVar1) {
                fputc((int)uVar5,(FILE *)output);
              }
              fputc(0x28,(FILE *)output);
              fprintf((FILE *)output,"%.12g, %.12g",*(undefined8 *)(lVar4 + 0x20),
                      *(undefined8 *)(lVar4 + 0x28));
              fwrite(");\n",3,1,(FILE *)output);
            }
            pEVar3 = EdgeHolder::operator*(this);
            lVar4 = __dynamic_cast(pEVar3,&EdgeSegment::typeinfo,&CubicSegment::typeinfo,0);
            if (lVar4 != 0) {
              fputc(9,(FILE *)output);
              fprintf((FILE *)output,"%.12g, %.12g",*(undefined8 *)(lVar4 + 0x10),
                      *(undefined8 *)(lVar4 + 0x18));
              fwrite(";\n\t\t",4,1,(FILE *)output);
              if (!bVar1) {
                fputc((int)uVar5,(FILE *)output);
              }
              fputc(0x28,(FILE *)output);
              fprintf((FILE *)output,"%.12g, %.12g",*(undefined8 *)(lVar4 + 0x20),
                      *(undefined8 *)(lVar4 + 0x28));
              fwrite("; ",2,1,(FILE *)output);
              fprintf((FILE *)output,"%.12g, %.12g",*(undefined8 *)(lVar4 + 0x30),
                      *(undefined8 *)(lVar4 + 0x38));
              fwrite(");\n",3,1,(FILE *)output);
            }
            this = this + 1;
          } while (this != (pCVar6->edges).
                           super__Vector_base<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
          fwrite("\t#\n",3,1,(FILE *)output);
        }
        fwrite("}\n",2,1,(FILE *)output);
        pCVar6 = pCVar6 + 1;
      } while (pCVar6 != (shape->contours).
                         super__Vector_base<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>.
                         _M_impl.super__Vector_impl_data._M_finish);
    }
  }
  return bVar2;
}

Assistant:

bool writeShapeDescription(FILE *output, const Shape &shape) {
    if (!shape.validate())
        return false;
    if (shape.inverseYAxis)
        fprintf(output, "@invert-y\n");
    for (std::vector<Contour>::const_iterator contour = shape.contours.begin(); contour != shape.contours.end(); ++contour) {
        fprintf(output, "{\n");
        if (!contour->edges.empty()) {
            for (std::vector<EdgeHolder>::const_iterator edge = contour->edges.begin(); edge != contour->edges.end(); ++edge) {
                char colorCode = '\0';
                switch ((*edge)->color) {
                    case YELLOW: colorCode = 'y'; break;
                    case MAGENTA: colorCode = 'm'; break;
                    case CYAN: colorCode = 'c'; break;
                    case WHITE: colorCode = 'w'; break;
                    default: break;
                }
                {
                    const LinearSegment *e = dynamic_cast<const LinearSegment *>(&**edge);
                    if (e) {
                        fprintf(output, "\t");
                        writeCoord(output, e->p[0]);
                        fprintf(output, ";\n");
                        if (colorCode)
                            fprintf(output, "\t\t%c;\n", colorCode);
                    }
                }
                {
                    const QuadraticSegment *e = dynamic_cast<const QuadraticSegment *>(&**edge);
                    if (e) {
                        fprintf(output, "\t");
                        writeCoord(output, e->p[0]);
                        fprintf(output, ";\n\t\t");
                        if (colorCode)
                            fprintf(output, "%c", colorCode);
                        fprintf(output, "(");
                        writeCoord(output, e->p[1]);
                        fprintf(output, ");\n");
                    }
                }
                {
                    const CubicSegment *e = dynamic_cast<const CubicSegment *>(&**edge);
                    if (e) {
                        fprintf(output, "\t");
                        writeCoord(output, e->p[0]);
                        fprintf(output, ";\n\t\t");
                        if (colorCode)
                            fprintf(output, "%c", colorCode);
                        fprintf(output, "(");
                        writeCoord(output, e->p[1]);
                        fprintf(output, "; ");
                        writeCoord(output, e->p[2]);
                        fprintf(output, ");\n");
                    }
                }
            }
            fprintf(output, "\t#\n");
        }
        fprintf(output, "}\n");
    }
    return true;
}